

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void analyzeTable(Parse *pParse,Table *pTab,Index *pOnlyIdx)

{
  uint uVar1;
  int iStatCur;
  int iVar2;
  Schema **ppSVar3;
  int iTab;
  Parse *pPVar4;
  int iDb;
  ulong uVar5;
  
  if (pTab->pSchema == (Schema *)0x0) {
    uVar5 = 0xfff0bdc0;
  }
  else {
    uVar1 = pParse->db->nDb;
    if ((int)uVar1 < 1) {
      uVar5 = 0;
    }
    else {
      ppSVar3 = &pParse->db->aDb->pSchema;
      uVar5 = 0;
      do {
        if (*ppSVar3 == pTab->pSchema) goto LAB_0025292a;
        uVar5 = uVar5 + 1;
        ppSVar3 = ppSVar3 + 4;
      } while (uVar1 != uVar5);
      uVar5 = (ulong)uVar1;
    }
  }
LAB_0025292a:
  pPVar4 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar4 = pParse;
  }
  iDb = (int)uVar5;
  sqlite3CodeVerifySchema(pParse,iDb);
  pPVar4->writeMask = pPVar4->writeMask | 1 << ((byte)uVar5 & 0x1f);
  iStatCur = pParse->nTab;
  pParse->nTab = iStatCur + 3;
  if (pOnlyIdx == (Index *)0x0) {
    openStatTable(pParse,iDb,iStatCur,pTab->zName,"tbl");
    iTab = pParse->nTab;
    iVar2 = pParse->nMem;
    pOnlyIdx = (Index *)0x0;
  }
  else {
    openStatTable(pParse,iDb,iStatCur,pOnlyIdx->zName,"idx");
    iTab = pParse->nTab;
    iVar2 = pParse->nMem;
  }
  analyzeOneTable(pParse,pTab,pOnlyIdx,iStatCur,iVar2 + 1,iTab);
  loadAnalysis(pParse,iDb);
  return;
}

Assistant:

static void analyzeTable(Parse *pParse, Table *pTab, Index *pOnlyIdx){
  int iDb;
  int iStatCur;

  assert( pTab!=0 );
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  sqlite3BeginWriteOperation(pParse, 0, iDb);
  iStatCur = pParse->nTab;
  pParse->nTab += 3;
  if( pOnlyIdx ){
    openStatTable(pParse, iDb, iStatCur, pOnlyIdx->zName, "idx");
  }else{
    openStatTable(pParse, iDb, iStatCur, pTab->zName, "tbl");
  }
  analyzeOneTable(pParse, pTab, pOnlyIdx, iStatCur,pParse->nMem+1,pParse->nTab);
  loadAnalysis(pParse, iDb);
}